

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

size_type __thiscall wabt::string_view::rfind(string_view *this,string_view s,size_type pos)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  reverse_iterator<const_char_*> local_40;
  reverse_iterator<const_char_*> local_38;
  reverse_iterator<const_char_*> local_30;
  char *local_28;
  reverse_iterator<const_char_*> local_20;
  reverse_iterator iter;
  
  sVar3 = s.size_;
  local_28 = s.data_;
  uVar1 = this->size_;
  uVar4 = uVar1 - sVar3;
  if (pos <= uVar1 - sVar3) {
    uVar4 = pos;
  }
  uVar5 = uVar4 + sVar3;
  if (uVar1 < uVar4 + sVar3) {
    uVar5 = uVar1;
  }
  local_38.current = this->data_;
  local_40.current = local_38.current + uVar5;
  local_30.current = local_28 + sVar3;
  std::search<std::reverse_iterator<char_const*>,std::reverse_iterator<char_const*>>
            (&local_20,&local_40,&local_38,&local_30);
  sVar2 = 0xffffffffffffffff;
  if (local_20.current != this->data_) {
    sVar2 = (long)local_20.current - (long)(this->data_ + sVar3);
  }
  return sVar2;
}

Assistant:

string_view::size_type string_view::rfind(string_view s, size_type pos) const
    noexcept {
  pos = std::min(std::min(pos, size_ - s.size_) + s.size_, size_);
  reverse_iterator iter = std::search(reverse_iterator(begin() + pos), rend(),
                                      s.rbegin(), s.rend());
  return iter == rend() ? npos : (rend() - iter - s.size_);
}